

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatchCommand.cxx
# Opt level: O2

void anon_unknown.dwarf_1599074::cmVariableWatchCommandVariableAccessed
               (string *variable,int access_type,void *client_data,char *newValue,cmMakefile *mf)

{
  bool bVar1;
  string *psVar2;
  long lVar3;
  _Elt_pointer __s;
  initializer_list<cmListFileArgument> __l;
  cmListFileFunction newLFF;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> newLFFArgs;
  undefined1 *local_288;
  undefined8 local_280;
  undefined1 local_278 [16];
  undefined1 *local_268;
  undefined8 local_260;
  undefined1 local_258 [16];
  undefined1 *local_248;
  undefined8 local_240;
  undefined1 local_238 [16];
  undefined1 *local_228;
  pointer local_220;
  undefined1 local_218 [8];
  pointer pbStack_210;
  cmMakefile *local_208;
  pointer local_200;
  undefined1 local_1f8 [16];
  string local_1e8;
  cmExecutionStatus status;
  string accessString;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> local_b8;
  string local_98;
  string stack;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  if (*client_data == '\0') {
    *(undefined1 *)client_data = 1;
    psVar2 = cmVariableWatch::GetAccessAsString_abi_cxx11_(access_type);
    std::__cxx11::string::string((string *)&accessString,(string *)psVar2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&status,"LISTFILE_STACK",(allocator<char> *)(local_1f8 + 0x10));
    psVar2 = (string *)cmMakefile::GetProperty(mf,(string *)&status);
    if (psVar2 == (string *)0x0) {
      psVar2 = &cmValue::Empty_abi_cxx11_;
    }
    std::__cxx11::string::string((string *)&stack,(string *)psVar2);
    std::__cxx11::string::~string((string *)&status);
    if (*(long *)((long)client_data + 0x10) == 0) {
      local_1e8._M_dataplus._M_p = (pointer)(_Elt_pointer)0x80b2f9;
      if (newValue != (char *)0x0) {
        local_1e8._M_dataplus._M_p = newValue;
      }
      cmStrCat<char_const(&)[11],std::__cxx11::string_const&,char_const(&)[22],std::__cxx11::string&,char_const(&)[14],char_const*,char_const(&)[3]>
                ((string *)&status,(char (*) [11])"Variable \"",variable,
                 (char (*) [22])"\" was accessed using ",&accessString,
                 (char (*) [14])" with value \"",(char **)(local_1f8 + 0x10),(char (*) [3])0x795130)
      ;
      cmMakefile::IssueMessage(mf,LOG,(string *)&status);
      std::__cxx11::string::~string((string *)&status);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&status,"CMAKE_CURRENT_LIST_FILE",(allocator<char> *)(local_1f8 + 0x10));
      psVar2 = (string *)cmMakefile::GetDefinition(mf,(string *)&status);
      std::__cxx11::string::~string((string *)&status);
      std::__cxx11::string::string((string *)&local_208,(string *)variable);
      status.Error._M_dataplus._M_p = local_200;
      status.Makefile = (cmMakefile *)&status.Error._M_string_length;
      if (local_208 == (cmMakefile *)local_1f8) {
        status.Error.field_2._M_allocated_capacity = local_1f8._8_8_;
      }
      else {
        status.Makefile = local_208;
      }
      local_200 = (pointer)0x0;
      local_1f8[0] = 0;
      status.Error.field_2._8_4_ = 1;
      status.ReturnInvoked = true;
      status.BreakInvoked = true;
      status.ContinueInvoked = true;
      status.NestedError = true;
      status.ExitCode.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_payload = (_Storage<int,_true>)0x7fffffff;
      local_208 = (cmMakefile *)local_1f8;
      std::__cxx11::string::string((string *)&local_228,(string *)&accessString);
      status.Variables.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_220;
      status._48_8_ =
           &status.Variables.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
      if (local_228 == local_218) {
        status.Variables.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pbStack_210;
      }
      else {
        status._48_8_ = local_228;
      }
      local_220 = (pointer)0x0;
      local_218[0] = 0;
      __s = (_Elt_pointer)0x80b2f9;
      if (newValue != (char *)0x0) {
        __s = (_Elt_pointer)newValue;
      }
      local_228 = local_218;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_248,(char *)__s,(allocator<char> *)(local_1f8 + 0x10));
      local_248 = local_238;
      local_240 = 0;
      local_238[0] = 0;
      if (psVar2 == (string *)0x0) {
        psVar2 = &cmValue::Empty_abi_cxx11_;
      }
      std::__cxx11::string::string((string *)&local_268,(string *)psVar2);
      local_268 = local_258;
      local_260 = 0;
      local_258[0] = 0;
      std::__cxx11::string::string((string *)&local_288,(string *)&stack);
      local_288 = local_278;
      local_280 = 0;
      local_278[0] = 0;
      __l._M_len = 5;
      __l._M_array = (iterator)&status;
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::vector
                (&newLFFArgs,__l,(allocator_type *)&newLFF);
      lVar3 = 0xc0;
      do {
        std::__cxx11::string::~string((string *)((long)&status.Makefile + lVar3));
        lVar3 = lVar3 + -0x30;
      } while (lVar3 != -0x30);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::string((string *)&local_98,(string *)((long)client_data + 8));
      local_b8.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_start =
           newLFFArgs.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_b8.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_finish =
           newLFFArgs.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_b8.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           newLFFArgs.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      newLFFArgs.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      newLFFArgs.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      newLFFArgs.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmListFileFunction::cmListFileFunction
                (&newLFF,&local_98,0x7fffffffffffffff,0x7fffffffffffffff,&local_b8);
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&local_b8);
      std::__cxx11::string::~string((string *)&local_98);
      cmExecutionStatus::cmExecutionStatus(&status,mf);
      local_58._M_engaged = false;
      bVar1 = cmMakefile::ExecuteCommand
                        (mf,&newLFF,&status,
                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_58);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset(&local_58);
      if (!bVar1) {
        cmStrCat<char_const(&)[87],std::__cxx11::string&,char_const(&)[3]>
                  ((string *)(local_1f8 + 0x10),
                   (char (*) [87])
                   "Error in cmake code at\nUnknown:0:\nA command failed during the invocation of callback \""
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)client_data + 8),(char (*) [3])0x795130);
        cmSystemTools::Error((string *)(local_1f8 + 0x10));
        std::__cxx11::string::~string((string *)(local_1f8 + 0x10));
      }
      cmExecutionStatus::~cmExecutionStatus(&status);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&newLFF.Impl.
                  super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&newLFFArgs);
    }
    *(undefined1 *)client_data = 0;
    std::__cxx11::string::~string((string *)&stack);
    std::__cxx11::string::~string((string *)&accessString);
  }
  return;
}

Assistant:

void cmVariableWatchCommandVariableAccessed(const std::string& variable,
                                            int access_type, void* client_data,
                                            const char* newValue,
                                            const cmMakefile* mf)
{
  cmVariableWatchCallbackData* data =
    static_cast<cmVariableWatchCallbackData*>(client_data);

  if (data->InCallback) {
    return;
  }
  data->InCallback = true;

  auto accessString = cmVariableWatch::GetAccessAsString(access_type);

  /// Ultra bad!!
  cmMakefile* makefile = const_cast<cmMakefile*>(mf);

  std::string stack = *mf->GetProperty("LISTFILE_STACK");
  if (!data->Command.empty()) {
    cmValue const currentListFile =
      mf->GetDefinition("CMAKE_CURRENT_LIST_FILE");
    const auto fakeLineNo =
      std::numeric_limits<decltype(cmListFileArgument::Line)>::max();

    std::vector<cmListFileArgument> newLFFArgs{
      { variable, cmListFileArgument::Quoted, fakeLineNo },
      { accessString, cmListFileArgument::Quoted, fakeLineNo },
      { newValue ? newValue : "", cmListFileArgument::Quoted, fakeLineNo },
      { *currentListFile, cmListFileArgument::Quoted, fakeLineNo },
      { stack, cmListFileArgument::Quoted, fakeLineNo }
    };

    cmListFileFunction newLFF{ data->Command, fakeLineNo, fakeLineNo,
                               std::move(newLFFArgs) };
    cmExecutionStatus status(*makefile);
    if (!makefile->ExecuteCommand(newLFF, status)) {
      cmSystemTools::Error(
        cmStrCat("Error in cmake code at\nUnknown:0:\nA command failed "
                 "during the invocation of callback \"",
                 data->Command, "\"."));
    }
  } else {
    makefile->IssueMessage(
      MessageType::LOG,
      cmStrCat("Variable \"", variable, "\" was accessed using ", accessString,
               " with value \"", (newValue ? newValue : ""), "\"."));
  }

  data->InCallback = false;
}